

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyPowerAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::StickyPowerAtomTypesSectionParser::parseLine
          (StickyPowerAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  int iVar3;
  AtomType *pAVar4;
  RealType w0;
  RealType RVar5;
  RealType RVar6;
  RealType RVar7;
  RealType RVar8;
  RealType RVar9;
  RealType RVar10;
  StickyAdapter sa;
  string atomTypeName;
  StringTokenizer tokenizer;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&atomTypeName," ;\t\n\r",(allocator<char> *)&sa);
  StringTokenizer::StringTokenizer(&tokenizer,line,&atomTypeName);
  std::__cxx11::string::~string((string *)&atomTypeName);
  iVar3 = StringTokenizer::countTokens(&tokenizer);
  if (iVar3 < 8) {
    snprintf(painCave.errMsg,2000,
             "StickyPowerAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    dVar1 = (this->options_->EnergyUnitScaling).data_;
    dVar2 = (this->options_->DistanceUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&atomTypeName,&tokenizer);
    pAVar4 = ForceField::getAtomType(ff,&atomTypeName);
    if (pAVar4 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "StickyPowerAtomTypesSectionParser Error: Can not find matching AtomType %s\n",
               atomTypeName._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      sa.at_ = pAVar4;
      w0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar5 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar6 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar9 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      StickyAdapter::makeSticky
                (&sa,w0,RVar5 * dVar1,RVar6 * dVar1,RVar7 * dVar2,RVar8 * dVar2,RVar9 * dVar2,
                 RVar10 * dVar2,true);
    }
    std::__cxx11::string::~string((string *)&atomTypeName);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void StickyPowerAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens  = tokenizer.countTokens();
    RealType dus = options_.getDistanceUnitScaling();
    RealType eus = options_.getEnergyUnitScaling();

    // in AtomTypeSection, a line at least contains 8 tokens
    // atomTypeName and 7 different sticky parameters
    if (nTokens < 8) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyPowerAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      string atomTypeName = tokenizer.nextToken();
      AtomType* atomType  = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        StickyAdapter sa = StickyAdapter(atomType);

        RealType w0  = tokenizer.nextTokenAsDouble();
        RealType v0  = eus * tokenizer.nextTokenAsDouble();
        RealType v0p = eus * tokenizer.nextTokenAsDouble();
        RealType rl  = dus * tokenizer.nextTokenAsDouble();
        RealType ru  = dus * tokenizer.nextTokenAsDouble();
        RealType rlp = dus * tokenizer.nextTokenAsDouble();
        RealType rup = dus * tokenizer.nextTokenAsDouble();
        bool isPower = true;

        sa.makeSticky(w0, v0, v0p, rl, ru, rlp, rup, isPower);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StickyPowerAtomTypesSectionParser Error: Can not find "
                 "matching AtomType %s\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }